

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

void wasm::
     CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
     ::doEndThrowingInst(Optimizer *self,Expression **currp)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  reference ppEVar5;
  Try *this;
  Try *pTVar6;
  reference this_00;
  int local_30;
  int j;
  bool found;
  Try *tryy;
  int i;
  Expression **currp_local;
  Optimizer *self_local;
  
  sVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                    (&(self->
                      super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                      ).
                      super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                      .unwindExprStack);
  sVar4 = std::
          vector<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>_>_>
          ::size(&(self->
                  super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                  ).
                  super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                  .throwingInstsStack);
  if (sVar3 != sVar4) {
    __assert_fail("self->unwindExprStack.size() == self->throwingInstsStack.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x104,
                  "static void wasm::CFGWalker<wasm::(anonymous namespace)::Optimizer, wasm::Visitor<wasm::(anonymous namespace)::Optimizer>, wasm::(anonymous namespace)::BlockInfo>::doEndThrowingInst(SubType *, Expression **) [SubType = wasm::(anonymous namespace)::Optimizer, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Optimizer>, Contents = wasm::(anonymous namespace)::BlockInfo]"
                 );
  }
  sVar3 = std::
          vector<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>_>_>
          ::size(&(self->
                  super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                  ).
                  super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                  .throwingInstsStack);
  tryy._4_4_ = (int)sVar3 + -1;
  do {
    while( true ) {
      if (tryy._4_4_ < 0) {
        return;
      }
      ppEVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                          (&(self->
                            super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                            ).
                            super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                            .unwindExprStack,(long)tryy._4_4_);
      this = Expression::cast<wasm::Try>(*ppEVar5);
      bVar1 = Try::isDelegate(this);
      if (bVar1) break;
      this_00 = std::
                vector<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>_>_>
                ::operator[](&(self->
                              super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                              ).
                              super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                              .throwingInstsStack,(long)tryy._4_4_);
      std::
      vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>
      ::push_back(this_00,&(self->
                           super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                           ).
                           super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                           .currBasicBlock);
      bVar1 = Try::hasCatchAll(this);
      if (bVar1) {
        return;
      }
      tryy._4_4_ = tryy._4_4_ + -1;
    }
    bVar1 = IString::operator==(&(this->delegateTarget).super_IString,
                                (IString *)&DELEGATE_CALLER_TARGET);
    if (bVar1) {
      return;
    }
    bVar1 = false;
    local_30 = tryy._4_4_;
    do {
      local_30 = local_30 + -1;
      if (local_30 < 0) goto LAB_0188ee59;
      ppEVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                          (&(self->
                            super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                            ).
                            super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                            .unwindExprStack,(long)local_30);
      pTVar6 = Expression::cast<wasm::Try>(*ppEVar5);
      bVar2 = IString::operator==(&(pTVar6->name).super_IString,
                                  &(this->delegateTarget).super_IString);
    } while (!bVar2);
    tryy._4_4_ = local_30;
    bVar1 = true;
LAB_0188ee59:
    if (!bVar1) {
      __assert_fail("found",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x118,
                    "static void wasm::CFGWalker<wasm::(anonymous namespace)::Optimizer, wasm::Visitor<wasm::(anonymous namespace)::Optimizer>, wasm::(anonymous namespace)::BlockInfo>::doEndThrowingInst(SubType *, Expression **) [SubType = wasm::(anonymous namespace)::Optimizer, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Optimizer>, Contents = wasm::(anonymous namespace)::BlockInfo]"
                   );
    }
  } while( true );
}

Assistant:

static void doEndThrowingInst(SubType* self, Expression** currp) {
    // If the innermost try does not have a catch_all clause, an exception
    // thrown can be caught by any of its outer catch block. And if that outer
    // try-catch also does not have a catch_all, this continues until we
    // encounter a try-catch_all. Create a link to all those possible catch
    // unwind destinations.
    // TODO This can be more precise for `throw`s if we compare tag types and
    // create links to outer catch BBs only when the exception is not caught.
    // TODO This can also be more precise if we analyze the structure of nested
    // try-catches. For example, in the example below, 'call $foo' doesn't need
    // a link to the BB of outer 'catch $e1', because if the exception thrown by
    // the call is of tag $e1, it would've already been caught by the inner
    // 'catch $e1'. Optimize these cases later.
    // try
    //   try
    //     call $foo
    //   catch $e1
    //     ...
    //   catch $e2
    //     ...
    //   end
    // catch $e1
    //   ...
    // catch $e3
    //   ...
    // end
    assert(self->unwindExprStack.size() == self->throwingInstsStack.size());
    for (int i = self->throwingInstsStack.size() - 1; i >= 0;) {
      auto* tryy = self->unwindExprStack[i]->template cast<Try>();
      if (tryy->isDelegate()) {
        // If this delegates to the caller, there is no possibility that this
        // instruction can throw to outer catches.
        if (tryy->delegateTarget == DELEGATE_CALLER_TARGET) {
          break;
        }
        // If this delegates to an outer try, we skip catches between this try
        // and the target try.
        [[maybe_unused]] bool found = false;
        for (int j = i - 1; j >= 0; j--) {
          if (self->unwindExprStack[j]->template cast<Try>()->name ==
              tryy->delegateTarget) {
            i = j;
            found = true;
            break;
          }
        }
        assert(found);
        continue;
      }

      // Exception thrown. Note outselves so that we will create a link to each
      // catch within the try when we get there.
      self->throwingInstsStack[i].push_back(self->currBasicBlock);

      // If this try has catch_all, there is no possibility that this
      // instruction can throw to outer catches. Stop here.
      if (tryy->hasCatchAll()) {
        break;
      }
      i--;
    }
  }